

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRenderPassCreateInfo *pass,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  VkSubpassDependency *pVVar1;
  VkAttachmentDescription *pVVar2;
  VkSubpassDescription *pVVar3;
  VkAttachmentReference *pVVar4;
  bool bVar5;
  uint32_t j;
  ulong uVar6;
  long lVar7;
  uint32_t i;
  ulong uVar8;
  Value dep;
  Value preserves;
  Value input;
  Data local_2a8;
  Value attachments;
  Value subpasses;
  Value deps;
  StringRefType local_260;
  StringRefType local_250;
  StringRefType local_240;
  StringRefType local_230;
  StringRefType local_220;
  StringRefType local_210;
  StringRefType local_200;
  StringRefType local_1f0;
  StringRefType local_1e0;
  StringRefType local_1d0;
  StringRefType local_1c0;
  StringRefType local_1b0;
  StringRefType local_1a0;
  StringRefType local_190;
  StringRefType local_180;
  StringRefType local_170;
  StringRefType local_160;
  StringRefType local_150;
  StringRefType local_140;
  StringRefType local_130;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_2a8.n.i64 = (Number)0x0;
  local_2a8.s.str = (Ch *)0x3000000000000;
  local_40.s = "flags";
  local_40.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_2a8.s,&local_40,pass->flags,alloc);
  deps.data_.n = (Number)0x0;
  deps.data_.s.str = (Ch *)0x4000000000000;
  subpasses.data_.n = (Number)0x0;
  subpasses.data_.s.str = (Ch *)0x4000000000000;
  attachments.data_.n = (Number)0x0;
  attachments.data_.s.str = (Ch *)0x4000000000000;
  if (pass->pDependencies != (VkSubpassDependency *)0x0) {
    lVar7 = 0x18;
    for (uVar8 = 0; uVar8 < pass->dependencyCount; uVar8 = uVar8 + 1) {
      pVVar1 = pass->pDependencies;
      dep.data_.n = (Number)0x0;
      dep.data_.s.str = (Ch *)0x3000000000000;
      local_80.s = "dependencyFlags";
      local_80.length = 0xf;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_80,*(uint *)((long)&pVVar1->srcSubpass + lVar7),alloc);
      local_90.s = "dstAccessMask";
      local_90.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_90,*(uint *)((long)pVVar1 + lVar7 + -4),alloc);
      local_a0.s = "srcAccessMask";
      local_a0.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_a0,*(uint *)((long)pVVar1 + lVar7 + -8),alloc);
      local_b0.s = "dstStageMask";
      local_b0.length = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_b0,*(uint *)((long)pVVar1 + lVar7 + -0xc),alloc);
      local_c0.s = "srcStageMask";
      local_c0.length = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_c0,*(uint *)((long)pVVar1 + lVar7 + -0x10),alloc);
      local_d0.s = "dstSubpass";
      local_d0.length = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_d0,*(uint *)((long)pVVar1 + lVar7 + -0x14),alloc);
      local_e0.s = "srcSubpass";
      local_e0.length = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_e0,*(uint *)((long)pVVar1 + lVar7 + -0x18),alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&deps,&dep,alloc);
      lVar7 = lVar7 + 0x1c;
    }
    local_50.s = "dependencies";
    local_50.length = 0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_2a8.s,&local_50,&deps,alloc);
  }
  if (pass->pAttachments != (VkAttachmentDescription *)0x0) {
    lVar7 = 0x20;
    for (uVar8 = 0; uVar8 < pass->attachmentCount; uVar8 = uVar8 + 1) {
      pVVar2 = pass->pAttachments;
      dep.data_.n = (Number)0x0;
      dep.data_.s.str = (Ch *)0x3000000000000;
      local_f0.s = "flags";
      local_f0.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_f0,*(uint *)((long)pVVar2 + lVar7 + -0x20),alloc);
      local_100.s = "format";
      local_100.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkFormat>(&dep,&local_100,*(VkFormat *)((long)pVVar2 + lVar7 + -0x1c),alloc);
      local_110.s = "finalLayout";
      local_110.length = 0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkImageLayout>
                (&dep,&local_110,*(VkImageLayout *)((long)&pVVar2->flags + lVar7),alloc);
      local_120.s = "initialLayout";
      local_120.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkImageLayout>
                (&dep,&local_120,*(VkImageLayout *)((long)pVVar2 + lVar7 + -4),alloc);
      local_130.s = "loadOp";
      local_130.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentLoadOp>
                (&dep,&local_130,*(VkAttachmentLoadOp *)((long)pVVar2 + lVar7 + -0x14),alloc);
      local_140.s = "storeOp";
      local_140.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentStoreOp>
                (&dep,&local_140,*(VkAttachmentStoreOp *)((long)pVVar2 + lVar7 + -0x10),alloc);
      local_150.s = "samples";
      local_150.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkSampleCountFlagBits>
                (&dep,&local_150,*(VkSampleCountFlagBits *)((long)pVVar2 + lVar7 + -0x18),alloc);
      local_160.s = "stencilLoadOp";
      local_160.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentLoadOp>
                (&dep,&local_160,*(VkAttachmentLoadOp *)((long)pVVar2 + lVar7 + -0xc),alloc);
      local_170.s = "stencilStoreOp";
      local_170.length = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentStoreOp>
                (&dep,&local_170,*(VkAttachmentStoreOp *)((long)pVVar2 + lVar7 + -8),alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&attachments,&dep,alloc);
      lVar7 = lVar7 + 0x24;
    }
    local_60.s = "attachments";
    local_60.length = 0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_2a8.s,&local_60,&attachments,alloc);
  }
  for (uVar8 = 0; uVar8 < pass->subpassCount; uVar8 = uVar8 + 1) {
    pVVar3 = pass->pSubpasses;
    dep.data_.n = (Number)0x0;
    dep.data_.s.str = (Ch *)0x3000000000000;
    local_180.s = "flags";
    local_180.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&dep,&local_180,pVVar3[uVar8].flags,alloc);
    local_190.s = "pipelineBindPoint";
    local_190.length = 0x11;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkPipelineBindPoint>(&dep,&local_190,pVVar3[uVar8].pipelineBindPoint,alloc);
    if (pVVar3[uVar8].pPreserveAttachments != (uint32_t *)0x0) {
      preserves.data_.n = (Number)0x0;
      preserves.data_.s.str = (Ch *)0x4000000000000;
      for (uVar6 = 0; uVar6 < pVVar3[uVar8].preserveAttachmentCount; uVar6 = uVar6 + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack<unsigned_int>(&preserves,pVVar3[uVar8].pPreserveAttachments[uVar6],alloc);
      }
      local_1a0.s = "preserveAttachments";
      local_1a0.length = 0x13;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_1a0,&preserves,alloc);
    }
    if (pVVar3[uVar8].pInputAttachments != (VkAttachmentReference *)0x0) {
      preserves.data_.n = (Number)0x0;
      preserves.data_.s.str = (Ch *)0x4000000000000;
      for (uVar6 = 0; uVar6 < pVVar3[uVar8].inputAttachmentCount; uVar6 = uVar6 + 1) {
        input.data_.n = (Number)0x0;
        input.data_.s.str = (Ch *)0x3000000000000;
        pVVar4 = pVVar3[uVar8].pInputAttachments;
        local_1b0.s = "attachment";
        local_1b0.length = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&input,&local_1b0,pVVar4[uVar6].attachment,alloc);
        local_1c0.s = "layout";
        local_1c0.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>(&input,&local_1c0,pVVar4[uVar6].layout,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&preserves,&input,alloc);
      }
      local_1d0.s = "inputAttachments";
      local_1d0.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_1d0,&preserves,alloc);
    }
    if (pVVar3[uVar8].pColorAttachments != (VkAttachmentReference *)0x0) {
      preserves.data_.n = (Number)0x0;
      preserves.data_.s.str = (Ch *)0x4000000000000;
      for (uVar6 = 0; uVar6 < pVVar3[uVar8].colorAttachmentCount; uVar6 = uVar6 + 1) {
        input.data_.n = (Number)0x0;
        input.data_.s.str = (Ch *)0x3000000000000;
        pVVar4 = pVVar3[uVar8].pColorAttachments;
        local_1e0.s = "attachment";
        local_1e0.length = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&input,&local_1e0,pVVar4[uVar6].attachment,alloc);
        local_1f0.s = "layout";
        local_1f0.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>(&input,&local_1f0,pVVar4[uVar6].layout,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&preserves,&input,alloc);
      }
      local_200.s = "colorAttachments";
      local_200.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_200,&preserves,alloc);
    }
    if (pVVar3[uVar8].pResolveAttachments != (VkAttachmentReference *)0x0) {
      preserves.data_.n = (Number)0x0;
      preserves.data_.s.str = (Ch *)0x4000000000000;
      for (uVar6 = 0; uVar6 < pVVar3[uVar8].colorAttachmentCount; uVar6 = uVar6 + 1) {
        input.data_.n = (Number)0x0;
        input.data_.s.str = (Ch *)0x3000000000000;
        pVVar4 = pVVar3[uVar8].pResolveAttachments;
        local_210.s = "attachment";
        local_210.length = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&input,&local_210,pVVar4[uVar6].attachment,alloc);
        local_220.s = "layout";
        local_220.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>(&input,&local_220,pVVar4[uVar6].layout,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&preserves,&input,alloc);
      }
      local_230.s = "resolveAttachments";
      local_230.length = 0x12;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_230,&preserves,alloc);
    }
    if (pVVar3[uVar8].pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
      preserves.data_.n = (Number)0x0;
      preserves.data_.s.str = (Ch *)0x3000000000000;
      local_240.s = "attachment";
      local_240.length = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                (&preserves,&local_240,(pVVar3[uVar8].pDepthStencilAttachment)->attachment,alloc);
      local_250.s = "layout";
      local_250.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkImageLayout>
                (&preserves,&local_250,(pVVar3[uVar8].pDepthStencilAttachment)->layout,alloc);
      local_260.s = "depthStencilAttachment";
      local_260.length = 0x16;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_260,&preserves,alloc);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&subpasses,&dep,alloc);
  }
  local_70.s = "subpasses";
  local_70.length = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_2a8.s,&local_70,&subpasses,alloc);
  if (pass->pNext != (void *)0x0) {
    dep.data_.n = (Number)0x0;
    dep.data_.s.str = (Ch *)0x0;
    bVar5 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pass->pNext,alloc,&dep,(DynamicStateInfo *)0x0);
    if (!bVar5) {
      return false;
    }
    preserves.data_.n = (Number)anon_var_dwarf_40d33;
    preserves.data_._8_4_ = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_2a8.s,(StringRefType *)&preserves,&dep,alloc);
  }
  if (&local_2a8 != &out_value->data_) {
    (out_value->data_).n = local_2a8.n;
    (out_value->data_).s.str = local_2a8.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkRenderPassCreateInfo& pass, Allocator& alloc, Value *out_value)
{
	Value json_object(kObjectType);
	json_object.AddMember("flags", pass.flags, alloc);

	Value deps(kArrayType);
	Value subpasses(kArrayType);
	Value attachments(kArrayType);

	if (pass.pDependencies)
	{
		for (uint32_t i = 0; i < pass.dependencyCount; i++)
		{
			auto &d = pass.pDependencies[i];
			Value dep(kObjectType);
			dep.AddMember("dependencyFlags", d.dependencyFlags, alloc);
			dep.AddMember("dstAccessMask", d.dstAccessMask, alloc);
			dep.AddMember("srcAccessMask", d.srcAccessMask, alloc);
			dep.AddMember("dstStageMask", d.dstStageMask, alloc);
			dep.AddMember("srcStageMask", d.srcStageMask, alloc);
			dep.AddMember("dstSubpass", d.dstSubpass, alloc);
			dep.AddMember("srcSubpass", d.srcSubpass, alloc);
			deps.PushBack(dep, alloc);
		}
		json_object.AddMember("dependencies", deps, alloc);
	}

	if (pass.pAttachments)
	{
		for (uint32_t i = 0; i < pass.attachmentCount; i++)
		{
			auto &a = pass.pAttachments[i];
			Value att(kObjectType);

			att.AddMember("flags", a.flags, alloc);
			att.AddMember("format", a.format, alloc);
			att.AddMember("finalLayout", a.finalLayout, alloc);
			att.AddMember("initialLayout", a.initialLayout, alloc);
			att.AddMember("loadOp", a.loadOp, alloc);
			att.AddMember("storeOp", a.storeOp, alloc);
			att.AddMember("samples", a.samples, alloc);
			att.AddMember("stencilLoadOp", a.stencilLoadOp, alloc);
			att.AddMember("stencilStoreOp", a.stencilStoreOp, alloc);

			attachments.PushBack(att, alloc);
		}
		json_object.AddMember("attachments", attachments, alloc);
	}

	for (uint32_t i = 0; i < pass.subpassCount; i++)
	{
		auto &sub = pass.pSubpasses[i];
		Value p(kObjectType);
		p.AddMember("flags", sub.flags, alloc);
		p.AddMember("pipelineBindPoint", sub.pipelineBindPoint, alloc);

		if (sub.pPreserveAttachments)
		{
			Value preserves(kArrayType);
			for (uint32_t j = 0; j < sub.preserveAttachmentCount; j++)
				preserves.PushBack(sub.pPreserveAttachments[j], alloc);
			p.AddMember("preserveAttachments", preserves, alloc);
		}

		if (sub.pInputAttachments)
		{
			Value inputs(kArrayType);
			for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
			{
				Value input(kObjectType);
				auto &ia = sub.pInputAttachments[j];
				input.AddMember("attachment", ia.attachment, alloc);
				input.AddMember("layout", ia.layout, alloc);
				inputs.PushBack(input, alloc);
			}
			p.AddMember("inputAttachments", inputs, alloc);
		}

		if (sub.pColorAttachments)
		{
			Value colors(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value color(kObjectType);
				auto &c = sub.pColorAttachments[j];
				color.AddMember("attachment", c.attachment, alloc);
				color.AddMember("layout", c.layout, alloc);
				colors.PushBack(color, alloc);
			}
			p.AddMember("colorAttachments", colors, alloc);
		}

		if (sub.pResolveAttachments)
		{
			Value resolves(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value resolve(kObjectType);
				auto &r = sub.pResolveAttachments[j];
				resolve.AddMember("attachment", r.attachment, alloc);
				resolve.AddMember("layout", r.layout, alloc);
				resolves.PushBack(resolve, alloc);
			}
			p.AddMember("resolveAttachments", resolves, alloc);
		}

		if (sub.pDepthStencilAttachment)
		{
			Value depth_stencil(kObjectType);
			depth_stencil.AddMember("attachment", sub.pDepthStencilAttachment->attachment, alloc);
			depth_stencil.AddMember("layout", sub.pDepthStencilAttachment->layout, alloc);
			p.AddMember("depthStencilAttachment", depth_stencil, alloc);
		}

		subpasses.PushBack(p, alloc);
	}
	json_object.AddMember("subpasses", subpasses, alloc);

	if (!pnext_chain_add_json_value(json_object, pass, alloc, nullptr))
		return false;

	*out_value = json_object;
	return true;
}